

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_r6p_1lin.cpp
# Opt level: O2

bool testR6PSingleLin(void)

{
  pointer pRVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  char *pcVar6;
  long lVar7;
  RSSinglelinCameraPose *model;
  pointer pRVar8;
  double *local_4a8;
  Index local_4a0;
  undefined8 local_498;
  Matrix<double,_1,_1,0,_1,_1> *local_490;
  Vector2d *local_488;
  long local_480;
  Index local_478;
  MatrixXd X;
  MatrixXd u;
  RSSinglelinCameraPoseVector results;
  Vector3d local_418;
  Vector3d VStack_400;
  Vector3d local_3e8;
  Vector3d VStack_3d0;
  Matrix<double,__1,__1,_0,__1,__1> *local_3b8;
  double dStack_3b0;
  Vector2d temp;
  Vector2d temp_1;
  RSSinglelinCameraPose local_378;
  RSSinglelinCameraPose local_308;
  RSSinglelinCameraPose local_298;
  RSSinglelinCameraPose local_228;
  RSSinglelinCameraPose local_1b8;
  RSSinglelinCameraPose local_148;
  CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> local_d0 [32];
  CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>> local_b0 [32];
  CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>> local_90 [32];
  CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>> local_70 [32];
  CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>> local_50 [32];
  
  srand(2);
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0].
  _0_4_ = 3;
  local_4a8._0_4_ = 6;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&X,(int *)&local_418,(int *)&local_4a8);
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)CONCAT44(local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[0]._4_4_,2);
  local_4a8 = (double *)CONCAT44(local_4a8._4_4_,6);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&u,(int *)&local_418,(int *)&local_4a8);
  VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,6,0,3,6>>>
            (&X,(CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_6,_0,_3,_6>_>
                 *)&local_4a8);
  local_3b8 = (Matrix<double,__1,__1,_0,__1,__1> *)0x3ff0000000000000;
  dStack_3b0 = 0.0;
  for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
    local_4a8 = X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                + X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_rows * lVar7;
    local_4a0 = X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_488 = (Vector2d *)0x0;
    local_478 = X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_490 = (Matrix<double,_1,_1,0,_1,_1> *)&X;
    local_480 = lVar7;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&results,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               &local_4a8);
    iVar4 = rs1LinProjection((Vector3d *)&results,&temp,&local_418,&VStack_400,&local_3e8,
                             &VStack_3d0,(double)local_3b8,dStack_3b0,0.0,0);
    if (iVar4 != 0) {
      std::operator<<((ostream *)&std::cout,
                      "R6P singlelin, RS in x direction, test failed due to projection function\n");
      bVar2 = false;
      goto LAB_00153bf2;
    }
    local_4a8 = u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                + u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_rows * lVar7;
    local_4a0 = u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_488 = (Vector2d *)0x0;
    local_478 = u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_490 = (Matrix<double,_1,_1,0,_1,_1> *)&u;
    local_480 = lVar7;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,2,1,0,2,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_4a8,&temp);
  }
  results.super__Vector_base<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results.super__Vector_base<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = R6P1Lin(&X,&u,0,0.0,2,&results);
  pRVar1 = results.super__Vector_base<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar4 == 2) {
    pcVar6 = 
    "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 did not converge\n";
LAB_00153576:
    std::operator<<((ostream *)&std::cout,pcVar6);
LAB_00153582:
    bVar2 = false;
  }
  else {
    if (iVar4 == 1) {
      pcVar6 = 
      "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned no solution\n"
      ;
      goto LAB_00153576;
    }
    bVar5 = 0;
    for (pRVar8 = results.
                  super__Vector_base<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>.
                  _M_impl.super__Vector_impl_data._M_start; pRVar8 != pRVar1; pRVar8 = pRVar8 + 1) {
      local_148.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_148.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_148.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_148.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_148.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_148.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_148.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_148.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_148.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_148.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_148.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_148.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_148.f = (double)local_3b8;
      local_148.rd = dStack_3b0;
      local_1b8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_1b8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_1b8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_1b8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_1b8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_1b8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_1b8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_1b8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_1b8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_1b8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_1b8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_1b8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_1b8.f = pRVar8->f;
      local_1b8.rd = pRVar8->rd;
      bVar2 = isPoseApproxEqual<RSSinglelinCameraPose>(&local_148,&local_1b8);
      bVar5 = bVar5 | bVar2;
    }
    bVar2 = true;
    if (bVar5 == 0) {
      std::operator<<((ostream *)&std::cout,
                      "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned bad pose\n"
                     );
      goto LAB_00153582;
    }
  }
  local_3b8 = (Matrix<double,__1,__1,_0,__1,__1> *)0x3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>>::
  CommaInitializer<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (local_50,&VStack_400,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_4a8);
  local_498 = 0x4024000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_70,&local_418,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_4a8);
  local_490 = (Matrix<double,_1,_1,0,_1,_1> *)local_3b8;
  local_478 = 0x4024000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_90,&local_3e8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_4a8);
  local_490 = (Matrix<double,_1,_1,0,_1,_1> *)local_3b8;
  local_478 = 0x4024000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_b0,&VStack_3d0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_4a8);
  dStack_3b0 = 0.0;
  temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] = 0.0;
  temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_4a0 = 3;
  local_498 = 6;
  local_488 = &temp;
  local_480 = 1;
  local_478 = 6;
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::Replicate<Eigen::Matrix<double,3,1,0,3,1>,_1,_1>const>>
            (local_d0,&X,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Replicate<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1>_>_>
              *)&local_4a8);
  for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
    local_4a8 = X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                + X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_rows * lVar7;
    local_4a0 = X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_488 = (Vector2d *)0x0;
    local_478 = X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_490 = (Matrix<double,_1,_1,0,_1,_1> *)&X;
    local_480 = lVar7;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&temp,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               &local_4a8);
    iVar4 = rs1LinProjection((Vector3d *)&temp,&temp_1,&local_418,&VStack_400,&local_3e8,&VStack_3d0
                             ,(double)local_3b8,dStack_3b0,0.0,0);
    if (iVar4 != 0) {
      std::operator<<((ostream *)&std::cout,
                      "R6P singlelin, RS in x direction, test failed due to projection function\n");
      goto LAB_00153be3;
    }
    local_4a8 = u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                + u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_rows * lVar7;
    local_4a0 = u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_490 = (Matrix<double,_1,_1,0,_1,_1> *)&u;
    local_488 = (Vector2d *)0x0;
    local_478 = u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_480 = lVar7;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,2,1,0,2,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_4a8,&temp_1);
  }
  iVar4 = R6P1Lin(&X,&u,0,0.0,2,&results);
  pRVar1 = results.super__Vector_base<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar4 == 1) {
    pcVar6 = "R6P singlelin, RS in x direction, for random values returned no solution\n";
LAB_00153930:
    std::operator<<((ostream *)&std::cout,pcVar6);
LAB_0015393c:
    bVar2 = false;
  }
  else {
    if (iVar4 == 2) {
      pcVar6 = "R6P singlelin, RS in x direction, for random values did not converge\n";
      goto LAB_00153930;
    }
    bVar5 = 0;
    for (pRVar8 = results.
                  super__Vector_base<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>.
                  _M_impl.super__Vector_impl_data._M_start; pRVar8 != pRVar1; pRVar8 = pRVar8 + 1) {
      local_228.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_228.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_228.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_228.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_228.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_228.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_228.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_228.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_228.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_228.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_228.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_228.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_228.f = (double)local_3b8;
      local_228.rd = dStack_3b0;
      local_298.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_298.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_298.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_298.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_298.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_298.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_298.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_298.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_298.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_298.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_298.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_298.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_298.f = pRVar8->f;
      local_298.rd = pRVar8->rd;
      bVar3 = isPoseApproxEqual<RSSinglelinCameraPose>(&local_228,&local_298);
      bVar5 = bVar5 | bVar3;
    }
    if (bVar5 == 0) {
      std::operator<<((ostream *)&std::cout,
                      "R6P singlelin, RS in x direction, for random values returned bad pose\n");
      goto LAB_0015393c;
    }
  }
  for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
    local_4a8 = X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                + X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_rows * lVar7;
    local_4a0 = X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_488 = (Vector2d *)0x0;
    local_478 = X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_490 = (Matrix<double,_1,_1,0,_1,_1> *)&X;
    local_480 = lVar7;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&temp,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               &local_4a8);
    iVar4 = rs1LinProjection((Vector3d *)&temp,&temp_1,&local_418,&VStack_400,&local_3e8,&VStack_3d0
                             ,(double)local_3b8,dStack_3b0,0.0,1);
    if (iVar4 != 0) {
      std::operator<<((ostream *)&std::cout,
                      "R6P singlelin, RS in y direction, test failed due to projection function\n");
      goto LAB_00153be3;
    }
    local_4a8 = u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                + u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_rows * lVar7;
    local_4a0 = u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_490 = (Matrix<double,_1,_1,0,_1,_1> *)&u;
    local_488 = (Vector2d *)0x0;
    local_478 = u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_480 = lVar7;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,2,1,0,2,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_4a8,&temp_1);
  }
  iVar4 = R6P1Lin(&X,&u,1,0.0,2,&results);
  pRVar1 = results.super__Vector_base<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar4 == 1) {
    pcVar6 = "R6P singlelin, RS in y direction, for random values returned no solution\n";
LAB_00153bd7:
    std::operator<<((ostream *)&std::cout,pcVar6);
  }
  else {
    if (iVar4 == 2) {
      pcVar6 = "R6P singlelin, RS in y direction, for random values did not converge\n";
      goto LAB_00153bd7;
    }
    bVar5 = 0;
    for (pRVar8 = results.
                  super__Vector_base<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>.
                  _M_impl.super__Vector_impl_data._M_start; pRVar8 != pRVar1; pRVar8 = pRVar8 + 1) {
      local_308.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_308.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_308.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_418.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_308.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_308.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_308.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = VStack_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_308.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_308.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_308.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_308.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_308.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_308.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = VStack_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_308.f = (double)local_3b8;
      local_308.rd = dStack_3b0;
      local_378.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_378.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_378.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_378.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_378.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_378.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_378.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_378.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_378.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_378.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (pRVar8->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_378.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (pRVar8->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_378.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (pRVar8->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_378.f = pRVar8->f;
      local_378.rd = pRVar8->rd;
      bVar3 = isPoseApproxEqual<RSSinglelinCameraPose>(&local_308,&local_378);
      bVar5 = bVar5 | bVar3;
    }
    if (bVar5 != 0) goto LAB_00153be5;
    std::operator<<((ostream *)&std::cout,
                    "R6P singlelin, RS in y direction, for random values returned bad pose\n");
  }
LAB_00153be3:
  bVar2 = false;
LAB_00153be5:
  std::_Vector_base<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::~_Vector_base
            (&results.
              super__Vector_base<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>);
LAB_00153bf2:
  free(u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return bVar2;
}

Assistant:

bool testR6PSingleLin(){
    std::srand(2);
    Eigen::MatrixXd X(3,6);
    Eigen::MatrixXd u(2,6);
    
    double r0 = 0;
    int direction = 0;
    int n_points = 6;
    int maxpow = 2;
    
    bool passed = true;



    // // first test all zeros and f = 1 and X random
    RSSinglelinCameraPose gt;
    gt.v << 0,0,0;
    gt.w << 0,0,0;
    gt.C << 0,0,0;
    gt.t << 0,0,0;
    X = Eigen::Matrix<double,3,6>::Random();
    gt.f = 1;
    gt.rd = 0;


    // create exact 2D projections
    for (int i = 0; i < n_points; i++)
    {
        Eigen::Vector2d temp;
        if(rs1LinProjection(X.col(i), temp, gt.v, gt.C, gt.w, gt.t,  gt.f,  gt.rd,  r0,  direction)){
            std::cout << "R6P singlelin, RS in x direction, test failed due to projection function\n";
            return 0;
        }
        u.col(i) = temp;
    }

    RSSinglelinCameraPoseVector results;

    int res = R6P1Lin(X, u, direction, r0, maxpow, &results);
    if(res == ERR_NO_SOLUTION){
        std::cout << "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned no solution\n";
        passed = false;
    }else if(res == WARN_NO_CONVERGENCE){
        std::cout << "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 did not converge\n";
        passed = false;
    }else{
        bool ident = false;
        for (auto const& model: results)
        {
            if(isPoseApproxEqual(gt,model)){
                ident = true;
            }
        }
        if(!ident){
            std::cout << "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned bad pose\n";
            passed = false;
        }
    }

    // now test with random reasonable values

    gt.f = 1;
    gt.C << Eigen::Vector3d::Random();
    gt.v << Eigen::Vector3d::Random()/10;
    gt.w << Eigen::Vector3d::Random()/gt.f/10;
    gt.t << Eigen::Vector3d::Random()/gt.f/10;
    gt.rd = 0;
    X << Eigen::MatrixXd::Random(3,6) + Eigen::Vector3d(0,0,5).replicate(1,6);
    
    // create exact 2D projections
    for (int i = 0; i < n_points; i++)
    {
        Eigen::Vector2d temp;
        if(rs1LinProjection(X.col(i), temp, gt.v, gt.C, gt.w, gt.t,  gt.f,  gt.rd,  r0,  direction)){
            std::cout << "R6P singlelin, RS in x direction, test failed due to projection function\n";
            return 0;
        }
        u.col(i) = temp;
    }


    res = R6P1Lin(X, u, direction, r0, maxpow, &results);

    if(res == ERR_NO_SOLUTION){
        std::cout << "R6P singlelin, RS in x direction, for random values returned no solution\n";
        passed = false;
    }else if(res == WARN_NO_CONVERGENCE){
        std::cout << "R6P singlelin, RS in x direction, for random values did not converge\n";
        passed = false;
    }else{
        bool ident = false;
        for (auto const& model: results)
        {
            if(isPoseApproxEqual(gt,model)){
                ident = true;
            }
        }
        if(!ident){
            std::cout << "R6P singlelin, RS in x direction, for random values returned bad pose\n";
            passed = false;
        }
    }

    
    

    // Now test with the other RS direction
    direction = 1;
    // create exact 2D projections
    for (int i = 0; i < n_points; i++)
    {
        Eigen::Vector2d temp;
        if(rs1LinProjection(X.col(i), temp, gt.v, gt.C, gt.w, gt.t,  gt.f,  gt.rd,  r0,  direction)){
            std::cout << "R6P singlelin, RS in y direction, test failed due to projection function\n";
            return 0;
        }
        u.col(i) = temp;
    }

    res = R6P1Lin(X, u, direction, r0, maxpow, &results);

    if(res == ERR_NO_SOLUTION){
        std::cout << "R6P singlelin, RS in y direction, for random values returned no solution\n";
        passed = false;
    }else if(res == WARN_NO_CONVERGENCE){
        std::cout << "R6P singlelin, RS in y direction, for random values did not converge\n";
        passed = false;
    }else{
        bool ident = false;
        for (auto const& model: results)
        {
            if(isPoseApproxEqual(gt,model)){
                ident = true;
            }
        }
        if(!ident){
            std::cout << "R6P singlelin, RS in y direction, for random values returned bad pose\n";
            passed = false;
        }
    }

    return passed;

}